

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

_Bool store_create_random(store *store)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *poVar3;
  int local_48;
  object *local_40;
  object *known_obj;
  object *obj;
  object_kind *kind;
  wchar_t max_level;
  wchar_t min_level;
  wchar_t level;
  wchar_t tries;
  store *store_local;
  
  _level = store;
  _Var1 = store_is_black_market(store);
  if (_Var1) {
    kind._4_4_ = player->max_depth + 5;
    kind._0_4_ = player->max_depth + 0x14;
  }
  else {
    kind._4_4_ = 1;
    if (player->max_depth + -0x14 < 0) {
      local_48 = 0;
    }
    else {
      local_48 = player->max_depth + -0x14;
    }
    kind._0_4_ = (uint)z_info->store_magic_level + local_48;
  }
  if (0x37 < kind._4_4_) {
    kind._4_4_ = 0x37;
  }
  if (0x46 < (int)kind) {
    kind._0_4_ = 0x46;
  }
  min_level = L'\0';
  do {
    if (L'\x05' < min_level) {
      return false;
    }
    max_level = rand_range(kind._4_4_,(int)kind);
    _Var1 = store_is_black_market(_level);
    if (_Var1) {
      obj = (object *)get_obj_num(max_level,false,L'\0');
    }
    else {
      obj = (object *)store_get_choice(_level);
    }
    if (*(int *)((long)&obj->next + 4) != 1) {
      known_obj = object_new();
      object_prep(known_obj,(object_kind *)obj,max_level,RANDOMISE);
      apply_magic(known_obj,max_level,false,false,false,false);
      if (known_obj->artifact != (artifact *)0x0) {
        __assert_fail("!obj->artifact",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                      ,0x58b,"_Bool store_create_random(struct store *)");
      }
      _Var1 = tval_is_weapon(known_obj);
      if ((((_Var1) && ((known_obj->to_h < 0 || (known_obj->to_d < 0)))) ||
          ((_Var1 = tval_is_armor(known_obj), _Var1 && (known_obj->to_a < 0)))) ||
         (known_obj->curses != (curse_data *)0x0)) {
        object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
      }
      else {
        local_40 = object_new();
        known_obj->known = local_40;
        known_obj->known->notice = known_obj->known->notice | 2;
        object_set_base_known(player,known_obj);
        known_obj->known->notice = known_obj->known->notice | 2;
        player_know_object(player,known_obj);
        known_obj->origin = '\0';
        _Var1 = store_is_black_market(_level);
        if ((!_Var1) || (_Var1 = black_market_ok(_level->town,known_obj), _Var1)) {
          wVar2 = object_value_real(known_obj,L'\x01');
          if (wVar2 < L'\x01') {
            object_delete((chunk *)0x0,(chunk *)0x0,&local_40);
            known_obj->known = (object *)0x0;
            object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
          }
          else {
            mass_produce(known_obj);
            poVar3 = store_carry(_level,known_obj);
            if (poVar3 != (object *)0x0) {
              return true;
            }
            object_delete((chunk *)0x0,(chunk *)0x0,&local_40);
            known_obj->known = (object *)0x0;
            object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
          }
        }
        else {
          object_delete((chunk *)0x0,(chunk *)0x0,&local_40);
          known_obj->known = (object *)0x0;
          object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
        }
      }
    }
    min_level = min_level + L'\x01';
  } while( true );
}

Assistant:

static bool store_create_random(struct store *store)
{
	int tries, level;

	int min_level, max_level;

	/* Decide min/max levels */
	if (store_is_black_market(store)) {
		min_level = player->max_depth + 5;
		max_level = player->max_depth + 20;
	} else {
		min_level = 1;
		max_level = z_info->store_magic_level + MAX(player->max_depth - 20, 0);
	}

	if (min_level > 55) min_level = 55;
	if (max_level > 70) max_level = 70;

	/* Consider up to six items */
	for (tries = 0; tries < 6; tries++) {
		struct object_kind *kind;
		struct object *obj, *known_obj;

		/* Work out the level for objects to be generated at */
		level = rand_range(min_level, max_level);

		/* Black Markets have a random object, of a given level */
		if (store_is_black_market(store))
			kind = get_obj_num(level, false, 0);
		else
			kind = store_get_choice(store);

		/*** Pre-generation filters ***/

		/* No chests in stores XXX */
		if (kind->tval == TV_CHEST) continue;

		/*** Generate the item ***/

		/* Create a new object of the chosen kind */
		obj = object_new();
		object_prep(obj, kind, level, RANDOMISE);

		/* Apply some "low-level" magic (no artifacts) */
		apply_magic(obj, level, false, false, false, false);
		assert(!obj->artifact);

		/* Reject if item is 'damaged' (negative combat mods, curses) */
		if ((tval_is_weapon(obj) && ((obj->to_h < 0) || (obj->to_d < 0)))
			|| (tval_is_armor(obj) && (obj->to_a < 0)) || (obj->curses)) {
			object_delete(NULL, NULL, &obj);
			continue;
		}

		/*** Post-generation filters ***/

		/* Make a known object */
		known_obj = object_new();
		obj->known = known_obj;

		/* Know everything the player knows, no origin yet */
		obj->known->notice |= OBJ_NOTICE_ASSESSED;
		object_set_base_known(player, obj);
		obj->known->notice |= OBJ_NOTICE_ASSESSED;
		player_know_object(player, obj);
		obj->origin = ORIGIN_NONE;

		/* Black markets have expensive tastes */
		if ((store_is_black_market(store)) &&
			!black_market_ok(store->town, obj)) {
			object_delete(NULL, NULL, &known_obj);
			obj->known = NULL;
			object_delete(NULL, NULL, &obj);
			continue;
		}

		/* No "worthless" items */
		if (object_value_real(obj, 1) < 1)  {
			object_delete(NULL, NULL, &known_obj);
			obj->known = NULL;
			object_delete(NULL, NULL, &obj);
			continue;
		}

		/* Mass produce and/or apply discount */
		mass_produce(obj);

		/* Attempt to carry the object */
		if (!store_carry(store, obj)) {
			object_delete(NULL, NULL, &known_obj);
			obj->known = NULL;
			object_delete(NULL, NULL, &obj);
			continue;
		}

		/* Definitely done */
		return true;
	}

	return false;
}